

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int wait_until_io_stream_ready(pa_stream *stream,pa_threaded_mainloop *mainloop)

{
  pa_stream_state_t x;
  int iVar1;
  pa_threaded_mainloop *in_RSI;
  pa_stream *in_RDI;
  pa_stream_state_t state;
  
  if ((in_RDI != (pa_stream *)0x0) && (in_RSI != (pa_threaded_mainloop *)0x0)) {
    while( true ) {
      x = (*cubeb_pa_stream_get_state)(in_RDI);
      iVar1 = PA_STREAM_IS_GOOD(x);
      if (iVar1 == 0) break;
      if (x == PA_STREAM_READY) {
        return 0;
      }
      (*cubeb_pa_threaded_mainloop_wait)(in_RSI);
    }
  }
  return -1;
}

Assistant:

static int
wait_until_io_stream_ready(pa_stream * stream, pa_threaded_mainloop * mainloop)
{
  if (!stream || !mainloop){
    return -1;
  }
  for (;;) {
    pa_stream_state_t state = WRAP(pa_stream_get_state)(stream);
    if (!PA_STREAM_IS_GOOD(state))
      return -1;
    if (state == PA_STREAM_READY)
      break;
    WRAP(pa_threaded_mainloop_wait)(mainloop);
  }
  return 0;
}